

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Metadata::InternalSwap(Metadata *this,Metadata *other)

{
  Metadata *other_local;
  Metadata *this_local;
  
  google::protobuf::internal::
  MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  ::Swap(&this->userdefined_,&other->userdefined_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->shortdescription_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->shortdescription_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->versionstring_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->versionstring_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&this->author_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&other->author_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&this->license_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&other->license_)
  ;
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void Metadata::InternalSwap(Metadata* other) {
  userdefined_.Swap(&other->userdefined_);
  shortdescription_.Swap(&other->shortdescription_);
  versionstring_.Swap(&other->versionstring_);
  author_.Swap(&other->author_);
  license_.Swap(&other->license_);
  std::swap(_cached_size_, other->_cached_size_);
}